

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ValueDriver * __thiscall
slang::BumpAllocator::emplace<slang::ast::ValueDriver,slang::ast::ValueDriver_const&>
          (BumpAllocator *this,ValueDriver *args)

{
  Expression *pEVar1;
  Symbol *pSVar2;
  bitmask<slang::ast::AssignFlags> bVar3;
  DriverKind DVar4;
  DriverSource DVar5;
  bool bVar6;
  undefined4 uVar7;
  ValueDriver *pVVar8;
  
  pVVar8 = (ValueDriver *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ValueDriver *)this->endPtr < pVVar8 + 1) {
    pVVar8 = (ValueDriver *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pVVar8 + 1);
  }
  pEVar1 = (args->prefixExpression).ptr;
  pSVar2 = (args->containingSymbol).ptr;
  bVar3.m_bits = (args->flags).m_bits;
  DVar4 = args->kind;
  DVar5 = args->source;
  bVar6 = args->isFromSideEffect;
  uVar7 = *(undefined4 *)&args->field_0x1c;
  pVVar8->procCallExpression = args->procCallExpression;
  pVVar8->flags = (bitmask<slang::ast::AssignFlags>)bVar3.m_bits;
  pVVar8->kind = DVar4;
  pVVar8->source = DVar5;
  pVVar8->isFromSideEffect = bVar6;
  *(undefined4 *)&pVVar8->field_0x1c = uVar7;
  (pVVar8->prefixExpression).ptr = pEVar1;
  (pVVar8->containingSymbol).ptr = pSVar2;
  return pVVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }